

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher_link.cpp
# Opt level: O0

void __thiscall
miniros::PublisherLink::PublisherLink
          (PublisherLink *this,SubscriptionPtr *parent,string *xmlrpc_uri,
          TransportHints *transport_hints)

{
  string *in_RDX;
  TransportHints *in_RDI;
  shared_ptr<miniros::Subscription> *in_stack_ffffffffffffffa8;
  weak_ptr<miniros::Subscription> *in_stack_ffffffffffffffb0;
  _Rb_tree_header *this_00;
  TransportHints *pTVar1;
  
  std::enable_shared_from_this<miniros::PublisherLink>::enable_shared_from_this
            ((enable_shared_from_this<miniros::PublisherLink> *)0x4946db);
  (in_RDI->transports_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__PublisherLink_0061efc8;
  pTVar1 = (TransportHints *)&in_RDI->options_;
  std::weak_ptr<miniros::Subscription>::weak_ptr<miniros::Subscription,void>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  *(undefined4 *)&(in_RDI->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = 0;
  std::__cxx11::string::string
            ((string *)&(in_RDI->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             in_RDX);
  Stats::Stats((Stats *)&in_RDI[1].transports_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
  this_00 = &in_RDI[1].options_._M_t._M_impl.super__Rb_tree_header;
  TransportHints::TransportHints(in_RDI,pTVar1);
  *(undefined1 *)&in_RDI[2].options_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  std::__cxx11::string::string
            ((string *)&in_RDI[2].options_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  Header::Header((Header *)this_00);
  std::__cxx11::string::string
            ((string *)
             &in_RDI[3].transports_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

PublisherLink::PublisherLink(const SubscriptionPtr& parent, const std::string& xmlrpc_uri, 
			     const TransportHints& transport_hints)
: parent_(parent)
, connection_id_(0)
, publisher_xmlrpc_uri_(xmlrpc_uri)
, transport_hints_(transport_hints)
, latched_(false)
{ }